

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_splitsolve.c
# Opt level: O0

_Bool test_lusplit(_Bool verbose,int niter,int n_row,int n_col,int n_bot_row,int field)

{
  _Bool _Var1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte in_DIL;
  int in_R8D;
  int in_R9D;
  _Bool succ;
  int i;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    if (in_ESI <= (int)local_1c) {
      return true;
    }
    _Var1 = stest_lusplit(in_EDX,in_ECX,in_R9D,in_EDX - in_R8D,(_Bool)(in_DIL & 1));
    if (!_Var1) break;
    local_1c = local_1c + 1;
  }
  fprintf(_stderr,"Failure for i=%d\n",(ulong)local_1c);
  return false;
}

Assistant:

static bool test_lusplit(bool verbose,
		int niter,
		int n_row,
		int n_col,
		int n_bot_row,
		int field)
{
	for (int i = 0; i < niter; ++i) {
		const bool
		  succ = stest_lusplit(
				n_row,
				n_col,
				field,
				n_row - n_bot_row,
				verbose);
		if (!succ) {
			fprintf(stderr, "Failure for i=%d\n", i);
			return false;
		}
	}
	return true;
}